

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

int __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::closer
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,UI *ui)

{
  pointer psVar1;
  uint uVar2;
  bool bVar3;
  uint extraout_EAX;
  uint uVar4;
  int extraout_EAX_00;
  long lVar5;
  uint uVar6;
  spectral_operation *t;
  ulong uVar7;
  pointer psVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  lVar5 = *(long *)ui;
  bVar11 = *(long *)(ui + 8) != lVar5;
  if (bVar11) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      uVar7 = (ulong)(this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar7];
      uVar4 = *(uint *)(lVar5 + uVar7 * 4);
      uVar6 = (this->best_spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      bVar3 = false;
      if (uVar4 != uVar6) {
        uVar2 = -uVar4;
        if (0 < (int)uVar4) {
          uVar2 = uVar4;
        }
        uVar10 = -uVar6;
        if (0 < (int)uVar6) {
          uVar10 = uVar6;
        }
        if ((uVar10 < uVar2) || (((int)uVar6 < (int)uVar4 && (uVar2 == uVar10)))) {
          update_best(this,(spectrum *)ui);
          bVar3 = true;
          uVar4 = extraout_EAX;
        }
        else {
          bVar3 = (int)uVar4 < (int)uVar6 && uVar2 == uVar10 || uVar2 < uVar10;
          uVar4 = CONCAT31((int3)(uVar4 >> 8),bVar3);
        }
      }
      if (bVar3) {
        if (bVar11) {
          return uVar4;
        }
        break;
      }
      lVar5 = *(long *)ui;
      uVar7 = *(long *)(ui + 8) - lVar5 >> 2;
      bVar11 = uVar9 < uVar7;
      bVar3 = uVar9 < uVar7;
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar3);
  }
  psVar8 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  uVar6 = 0;
  if (psVar8 != psVar1) {
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (uint)(psVar8->_kind == permutation) * 2 + 1;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar1);
  }
  psVar8 = (this->best_transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->best_transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar1) {
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (uint)(psVar8->_kind == permutation) * 2 + 1;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar1);
  }
  if (uVar4 <= uVar6) {
    return uVar4;
  }
  update_best(this,(spectrum *)ui);
  return extraout_EAX_00;
}

Assistant:

void closer( spectrum& lspec )
  {
    for ( auto i = 0u; i < lspec.size(); ++i )
    {
      const auto j = order[i];
      if ( lspec[j] == best_spec[j] )
      {
        continue;
      }
      if ( abs( lspec[j] ) > abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] > best_spec[j] ) )
      {
        update_best( lspec );
        return;
      }

      if ( abs( lspec[j] ) < abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] < best_spec[j] ) )
      {
        return;
      }
    }

    if ( transformation_costs( transforms ) < transformation_costs( best_transforms ) )
    {
      update_best( lspec );
    }
  }